

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

StringResult<QString> * __thiscall
QCborStreamReader::_readString_helper
          (StringResult<QString> *__return_storage_ptr__,QCborStreamReader *this)

{
  StringResultCode SVar1;
  ReadStringChunk params;
  StringResult<long_long> SVar2;
  
  *(undefined1 **)&__return_storage_ptr__->status = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.d = (Data *)0x0;
  (__return_storage_ptr__->data).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->data).d.size = 0;
  __return_storage_ptr__->status = Error;
  params.maxlen_or_type = -3;
  params.field_0.array = (QByteArray *)__return_storage_ptr__;
  SVar2 = QCborStreamReaderPrivate::readStringChunk(*(QCborStreamReaderPrivate **)(this + 8),params)
  ;
  SVar1 = SVar2.status;
  __return_storage_ptr__->status = SVar1;
  if (SVar1 == EndOfString) {
    if (*(int *)(*(long *)(this + 8) + 0x60) == 0) {
      preparse(this);
    }
  }
  else if (SVar1 == Error) {
    QString::clear(&__return_storage_ptr__->data);
  }
  return __return_storage_ptr__;
}

Assistant:

QCborStreamReader::StringResult<QString> QCborStreamReader::_readString_helper()
{
    QCborStreamReader::StringResult<QString> result;
    auto r = d->readStringChunk(&result.data);
    result.status = r.status;
    if (r.status == Error) {
        result.data.clear();
    } else {
        Q_ASSERT(r.data == result.data.size());
        if (r.status == EndOfString && lastError() == QCborError::NoError)
            preparse();
    }

    return result;
}